

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLexer.cpp
# Opt level: O2

void __thiscall Jinx::Impl::Lexer::CreateSymbol(Lexer *this,string_view name)

{
  String *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  const_iterator cVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
  *paVar5;
  char *extraout_RDX;
  string_view source;
  string_view source_00;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  value_type local_68;
  String local_30;
  
  local_78._M_str = name._M_str;
  local_78._M_len = name._M_len;
  this_00 = &local_68.text;
  local_68.type = NameValue;
  paVar5 = &local_68.text.field_2;
  local_68.text._M_string_length = 0;
  local_68.text.field_2._M_local_buf[0] = '\0';
  local_68.field_2.numVal = 0.0;
  uVar1 = this->m_columnMarker;
  uVar2 = this->m_lineNumber;
  local_68.columnNumber = uVar1;
  local_68.lineNumber = uVar2;
  local_68.text._M_dataplus._M_p = (pointer)paVar5;
  std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>::
  assign<std::basic_string_view<char,std::char_traits<char>>>
            ((basic_string<char,std::char_traits<char>,Jinx::Allocator<char>> *)this_00,&local_78);
  source._M_str = extraout_RDX;
  source._M_len = (size_t)local_78._M_str;
  bVar3 = IsCaseFolded((Impl *)local_78._M_len,source);
  if (!bVar3) {
    source_00._M_str = (char *)paVar5;
    source_00._M_len = (size_t)local_78._M_str;
    FoldCase_abi_cxx11_(&local_30,(Impl *)local_78._M_len,source_00);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::assign
              (this_00,local_30._M_dataplus._M_p);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
              (&local_30);
  }
  local_30._M_dataplus._M_p = (pointer)local_68.text._M_string_length;
  local_30._M_string_length = (size_type)local_68.text._M_dataplus._M_p;
  cVar4 = std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_Jinx::Impl::SymbolType>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_Jinx::Impl::SymbolType>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_Jinx::StaticAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_Jinx::Impl::SymbolType>,_4096UL,_16UL>_>
          ::find(&this->m_symbolTypeMap->_M_t,(key_type *)&local_30);
  if ((_Rb_tree_header *)cVar4._M_node ==
      &(this->m_symbolTypeMap->_M_t)._M_impl.super__Rb_tree_header) {
    bVar3 = std::operator==(this_00,"true");
    if (bVar3) {
      local_68.type = BooleanValue;
      local_68.field_2.boolVal = true;
    }
    else {
      bVar3 = std::operator==(this_00,"false");
      if (bVar3) {
        local_68.type = BooleanValue;
        local_68.field_2.intVal = local_68.field_2.intVal & 0xffffffffffffff00;
      }
    }
  }
  else {
    local_68.type = *(SymbolType *)&cVar4._M_node[1]._M_left;
  }
  std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>::push_back
            (&this->m_symbolList,&local_68);
  this->m_columnMarker = this->m_columnNumber;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
            (this_00);
  return;
}

Assistant:

inline_t void Lexer::CreateSymbol(std::string_view name)
	{
		Symbol symbol(SymbolType::NameValue, m_lineNumber, m_columnMarker);
		symbol.text = name;
		if (!IsCaseFolded(name))
			symbol.text = FoldCase(name).c_str();
		auto itr = m_symbolTypeMap.find(symbol.text);
		if (itr != m_symbolTypeMap.end())
		{
			symbol.type = itr->second;
		}
		else
		{
			// Special case detection of boolean 'true' and 'false' values.  We don't
			// want to make these symbol types.  Instead, they need to be a BooleanValue
			// type.
			if (symbol.text == "true")
			{
				symbol.type = SymbolType::BooleanValue;
				symbol.boolVal = true;
			}
			else if (symbol.text == "false")
			{
				symbol.type = SymbolType::BooleanValue;
				symbol.boolVal = false;
			}
		}
		m_symbolList.push_back(symbol);
		m_columnMarker = m_columnNumber;
	}